

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_acs.cpp
# Opt level: O0

void __thiscall FBehavior::UnencryptStrings(FBehavior *this)

{
  DWORD DVar1;
  long lVar2;
  byte bVar3;
  DWORD *pDVar4;
  int local_3c;
  int i;
  int p;
  BYTE last;
  BYTE *data;
  int ofs;
  DWORD strnum;
  DWORD *chunk;
  DWORD *prevchunk;
  FBehavior *this_local;
  
  chunk = (DWORD *)0x0;
  _ofs = (DWORD *)FindChunk(this,0x45525453);
  while (_ofs != (DWORD *)0x0) {
    for (data._4_4_ = 0; data._4_4_ < _ofs[3]; data._4_4_ = data._4_4_ + 1) {
      DVar1 = _ofs[data._4_4_ + 5];
      lVar2 = (long)(int)DVar1 + 8;
      local_3c = 0;
      do {
        bVar3 = *(byte *)((long)_ofs + local_3c + lVar2) ^
                (char)DVar1 * -0x31 + (char)(local_3c >> 1);
        *(byte *)((long)_ofs + local_3c + lVar2) = bVar3;
        local_3c = local_3c + 1;
      } while (bVar3 != 0);
    }
    chunk = _ofs;
    pDVar4 = (DWORD *)NextChunk(this,(BYTE *)_ofs);
    *_ofs = 0x4c525453;
    _ofs = pDVar4;
  }
  if (chunk != (DWORD *)0x0) {
    *chunk = 0x4c525453;
  }
  return;
}

Assistant:

void FBehavior::UnencryptStrings ()
{
	DWORD *prevchunk = NULL;
	DWORD *chunk = (DWORD *)FindChunk(MAKE_ID('S','T','R','E'));
	while (chunk != NULL)
	{
		for (DWORD strnum = 0; strnum < LittleLong(chunk[3]); ++strnum)
		{
			int ofs = LittleLong(chunk[5+strnum]);
			BYTE *data = (BYTE *)chunk + ofs + 8, last;
			int p = (BYTE)(ofs*157135);
			int i = 0;
			do
			{
				last = (data[i] ^= (BYTE)(p+(i>>1)));
				++i;
			} while (last != 0);
		}
		prevchunk = chunk;
		chunk = (DWORD *)NextChunk ((BYTE *)chunk);
		*prevchunk = MAKE_ID('S','T','R','L');
	}
	if (prevchunk != NULL)
	{
		*prevchunk = MAKE_ID('S','T','R','L');
	}
}